

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

void __thiscall
icu_63::UVector::insertElementAt(UVector *this,void *obj,int32_t index,UErrorCode *status)

{
  UElement *pUVar1;
  UBool UVar2;
  long lVar3;
  
  if (((-1 < index) && (index <= this->count)) &&
     (UVar2 = ensureCapacity(this,this->count + 1,status), UVar2 != '\0')) {
    for (lVar3 = (long)this->count; pUVar1 = this->elements, (long)(ulong)(uint)index < lVar3;
        lVar3 = lVar3 + -1) {
      pUVar1[lVar3] = pUVar1[lVar3 + -1];
    }
    pUVar1[(uint)index].pointer = obj;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector::insertElementAt(void* obj, int32_t index, UErrorCode &status) {
    // must have 0 <= index <= count
    if (0 <= index && index <= count && ensureCapacity(count + 1, status)) {
        for (int32_t i=count; i>index; --i) {
            elements[i] = elements[i-1];
        }
        elements[index].pointer = obj;
        ++count;
    }
    /* else index out of range */
}